

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O1

If_Box_t * If_LibBoxFindBox(If_LibBox_t *p,char *pName)

{
  void **ppvVar1;
  If_Box_t *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (p != (If_LibBox_t *)0x0) {
    lVar5 = (long)p->vBoxes->nSize;
    if (0 < lVar5) {
      ppvVar1 = p->vBoxes->pArray;
      lVar4 = 0;
      do {
        pIVar2 = (If_Box_t *)ppvVar1[lVar4];
        if ((pIVar2 != (If_Box_t *)0x0) && (iVar3 = strcmp(pIVar2->pName,pName), iVar3 == 0)) {
          return pIVar2;
        }
        lVar4 = lVar4 + 1;
      } while (lVar5 != lVar4);
    }
  }
  return (If_Box_t *)0x0;
}

Assistant:

If_Box_t * If_LibBoxFindBox( If_LibBox_t * p, char * pName )
{
    If_Box_t * pBox;
    int i;
    if ( p == NULL )
        return NULL;
    If_LibBoxForEachBox( p, pBox, i )
        if ( !strcmp(pBox->pName, pName) )
            return pBox;
    return NULL;
}